

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  pointer ppcVar1;
  cmLocalGenerator *pcVar2;
  cmState *this_00;
  char *pcVar3;
  allocator local_41;
  string local_40;
  
  ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar2 = *ppcVar1;
  this_00 = cmLocalGenerator::GetState(*ppcVar1);
  pcVar3 = cmState::GetBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_40,pcVar3,&local_41);
  cmOutputConverter::ConvertToRelativePath
            (__return_storage_ptr__,&pcVar2->super_cmOutputConverter,&local_40,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  NinjaOutputPath(&local_40,this,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ConvertToNinjaPath(
  const std::string& path) const
{
  cmLocalNinjaGenerator* ng =
    static_cast<cmLocalNinjaGenerator*>(this->LocalGenerators[0]);
  std::string convPath = ng->ConvertToRelativePath(
    this->LocalGenerators[0]->GetState()->GetBinaryDirectory(), path);
  convPath = this->NinjaOutputPath(convPath);
#ifdef _WIN32
  std::replace(convPath.begin(), convPath.end(), '/', '\\');
#endif
  return convPath;
}